

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag,ngram_model_t *lmset,float32 lwf,float32 ascale)

{
  void *pvVar1;
  int iVar2;
  int32 iVar3;
  bool bVar4;
  float fVar5;
  undefined8 local_b0;
  bool local_a4;
  bool local_a3;
  bool local_a2;
  bool local_a1;
  long *local_a0;
  ps_latlink_t *prev_link_1;
  s3wid_t local_90;
  int16 from_is_fil;
  int32 from_wid;
  int32 n_used_2;
  int32 bprob_1;
  int iStack_7c;
  int16 w1_is_fil;
  int32 w1_wid;
  int32 score;
  ps_latlink_t *prev_link;
  int16 w2_is_fil;
  int16 w3_is_fil;
  int32 w2_wid;
  int32 w3_wid;
  int32 n_used_1;
  int32 bprob;
  uint uStack_54;
  int16 to_is_fil;
  int32 n_used;
  int32 bestescr;
  logmath_t *lmath;
  latlink_list_t *x;
  ps_latlink_t *bestend;
  ps_latlink_t *link;
  ps_latnode_t *node;
  ps_search_t *search;
  float32 ascale_local;
  float32 lwf_local;
  ngram_model_t *lmset_local;
  ps_lattice_t *dag_local;
  
  node = (ps_latnode_t *)dag->search;
  _n_used = dag->lmath;
  search._0_4_ = ascale;
  search._4_4_ = lwf;
  _ascale_local = lmset;
  lmset_local = (ngram_model_t *)dag;
  for (link = (ps_latlink_t *)dag->nodes; link != (ps_latlink_t *)0x0; link = link[1].best_prev) {
    for (lmath = *(logmath_t **)&link->beta; lmath != (logmath_t *)0x0;
        lmath = *(logmath_t **)&(lmath->t).table_size) {
      *(undefined4 *)((long)(lmath->t).table + 0x1c) = 0x80000000;
      iVar2 = logmath_get_zero(_n_used);
      *(int *)((long)(lmath->t).table + 0x24) = iVar2;
    }
  }
  for (lmath = *(logmath_t **)(*(long *)&lmset_local->log_zero + 0x28); lmath != (logmath_t *)0x0;
      lmath = *(logmath_t **)&(lmath->t).table_size) {
    iVar2 = dict_filler_word((dict_t *)node->entries,
                             *(s3wid_t *)(*(long *)((long)(lmath->t).table + 8) + 8));
    local_a1 = false;
    if (iVar2 != 0) {
      local_a1 = *(char ***)((long)(lmath->t).table + 8) != lmset_local->word_str;
    }
    n_used_1._2_2_ = (ushort)local_a1;
    *(undefined4 *)((long)(lmath->t).table + 0x1c) = *(undefined4 *)((long)(lmath->t).table + 0x18);
    if ((_ascale_local != (ngram_model_t *)0x0) && (n_used_1._2_2_ == 0)) {
      iVar3 = ngram_bg_score(_ascale_local,*(int32 *)(*(long *)((long)(lmath->t).table + 8) + 8),
                             *(int32 *)&node[1].reachable,&bprob);
      pvVar1 = (lmath->t).table;
      *(int *)((long)pvVar1 + 0x1c) =
           (int)((float)(iVar3 >> 10) * (float)search._4_4_ + (float)*(int *)((long)pvVar1 + 0x1c));
    }
    *(undefined8 *)((long)(lmath->t).table + 0x10) = 0;
    *(undefined4 *)((long)(lmath->t).table + 0x24) = 0;
  }
  bestend = ps_lattice_traverse_edges
                      ((ps_lattice_t *)lmset_local,(ps_latnode_t *)0x0,(ps_latnode_t *)0x0);
  do {
    if (bestend == (ps_latlink_t *)0x0) {
      x = (latlink_list_t *)0x0;
      uStack_54 = 0x80000000;
      iVar2 = logmath_get_zero(_n_used);
      *(int *)((long)&lmset_local->tmp_wids + 4) = iVar2;
      lmath = (logmath_t *)lmset_local->word_str[6];
      do {
        if (lmath == (logmath_t *)0x0) {
          *(int *)((long)&lmset_local->tmp_wids + 4) =
               (int)((float)(*(int *)&lmset_local->tmp_wids << 10) * (float)search._0_4_ +
                    (float)*(int *)((long)&lmset_local->tmp_wids + 4));
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x566,"Bestpath score: %d\n",(ulong)uStack_54);
          if (*(int *)((long)lmset_local->word_str + 4) < 0) {
            local_b0 = 0;
          }
          else {
            local_b0 = *(undefined8 *)
                        (*(long *)(*(long *)(*(long *)&lmset_local->n_1g_alloc + 0x30) + 0x10) +
                        (long)*(int *)((long)lmset_local->word_str + 4) * 0x20);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x56a,"Normalizer P(O) = alpha(%s:%d:%d) = %d\n",local_b0,
                  (ulong)*(uint *)((long)lmset_local->word_str + 0x14),
                  *(undefined4 *)(lmset_local->word_str + 2),
                  *(undefined4 *)((long)&lmset_local->tmp_wids + 4));
          return (ps_latlink_t *)x;
        }
        local_90 = *(s3wid_t *)(*(lmath->t).table + 8);
        iVar2 = dict_filler_word((dict_t *)node->entries,local_90);
        bVar4 = false;
        if (iVar2 != 0) {
          bVar4 = *(lmath->t).table != *(long *)&lmset_local->log_zero;
        }
        if (bVar4) {
          local_a0 = (long *)(lmath->t).table;
          do {
            if (local_a0[2] == 0) goto LAB_00118758;
            local_a0 = (long *)local_a0[2];
            local_90 = *(s3wid_t *)(*local_a0 + 8);
            iVar2 = dict_filler_word((dict_t *)node->entries,local_90);
          } while ((iVar2 != 0) && (*local_a0 != *(long *)&lmset_local->log_zero));
          bVar4 = false;
        }
LAB_00118758:
        if ((_ascale_local == (ngram_model_t *)0x0) || (bVar4)) {
          from_wid = 0;
        }
        else {
          from_wid = ngram_ng_prob(_ascale_local,
                                   *(int32 *)(*(long *)((long)(lmath->t).table + 8) + 8),&local_90,1
                                   ,(int32 *)&stack0xffffffffffffff74);
        }
        iVar2 = logmath_add(_n_used,*(int *)((long)&lmset_local->tmp_wids + 4),
                            *(int *)((long)(lmath->t).table + 0x24) + from_wid);
        *(int *)((long)&lmset_local->tmp_wids + 4) = iVar2;
        if ((int)uStack_54 < *(int *)((long)(lmath->t).table + 0x1c)) {
          uStack_54 = *(uint *)((long)(lmath->t).table + 0x1c);
          x = (latlink_list_t *)(lmath->t).table;
        }
        lmath = *(logmath_t **)&(lmath->t).table_size;
      } while( true );
    }
    if (bestend->path_scr == -0x80000000) {
      __assert_fail("link->path_scr != MAX_NEG_INT32",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x4f1,
                    "ps_latlink_t *ps_lattice_bestpath(ps_lattice_t *, ngram_model_t *, float32, float32)"
                   );
    }
    _w2_is_fil = bestend->from->basewid;
    prev_link._4_4_ = bestend->to->basewid;
    iVar2 = dict_filler_word((dict_t *)node->entries,bestend->from->basewid);
    local_a2 = false;
    if (iVar2 != 0) {
      local_a2 = bestend->from != *(ps_latnode_s **)&lmset_local->log_zero;
    }
    prev_link._2_2_ = (ushort)local_a2;
    iVar2 = dict_filler_word((dict_t *)node->entries,prev_link._4_4_);
    local_a3 = false;
    if (iVar2 != 0) {
      local_a3 = bestend->to != (ps_latnode_s *)lmset_local->word_str;
    }
    prev_link._0_2_ = (ushort)local_a3;
    _w1_wid = bestend;
    if (prev_link._2_2_ != 0) {
      do {
        if (_w1_wid->best_prev == (ps_latlink_s *)0x0) goto LAB_001183c8;
        _w1_wid = _w1_wid->best_prev;
        _w2_is_fil = _w1_wid->from->basewid;
        iVar2 = dict_filler_word((dict_t *)node->entries,_w2_is_fil);
      } while ((iVar2 != 0) && (_w1_wid->from != *(ps_latnode_s **)&lmset_local->log_zero));
      prev_link._2_2_ = 0;
    }
LAB_001183c8:
    if (((_ascale_local == (ngram_model_t *)0x0) || (prev_link._2_2_ != 0)) ||
       ((ushort)prev_link != 0)) {
      w3_wid = 0;
    }
    else {
      w3_wid = ngram_ng_prob(_ascale_local,prev_link._4_4_,(int32 *)&w2_is_fil,1,&w2_wid);
    }
    bestend->alpha =
         (int)((float)(bestend->ascr << 10) * (float)search._0_4_ + (float)bestend->alpha);
    if ((ushort)prev_link != 0) {
      prev_link._0_2_ = prev_link._2_2_;
      prev_link._2_2_ = 1;
      prev_link._4_4_ = _w2_is_fil;
      do {
        if (_w1_wid->best_prev == (ps_latlink_s *)0x0) goto LAB_0011849e;
        _w1_wid = _w1_wid->best_prev;
        _w2_is_fil = _w1_wid->from->basewid;
        iVar2 = dict_filler_word((dict_t *)node->entries,_w2_is_fil);
      } while ((iVar2 != 0) && (_w1_wid->from != *(ps_latnode_s **)&lmset_local->log_zero));
      prev_link._2_2_ = 0;
    }
LAB_0011849e:
    for (lmath = (logmath_t *)bestend->to->exits; lmath != (logmath_t *)0x0;
        lmath = *(logmath_t **)&(lmath->t).table_size) {
      bprob_1 = *(s3wid_t *)(*(long *)((long)(lmath->t).table + 8) + 8);
      iVar2 = dict_filler_word((dict_t *)node->entries,bprob_1);
      local_a4 = false;
      if (iVar2 != 0) {
        local_a4 = *(char ***)((long)(lmath->t).table + 8) != lmset_local->word_str;
      }
      n_used_2._2_2_ = (ushort)local_a4;
      iVar2 = logmath_add(_n_used,*(int *)((long)(lmath->t).table + 0x24),bestend->alpha + w3_wid);
      *(int *)((long)(lmath->t).table + 0x24) = iVar2;
      iStack_7c = bestend->path_scr + *(int *)((long)(lmath->t).table + 0x18);
      if (((_ascale_local != (ngram_model_t *)0x0) && (n_used_2._2_2_ == 0)) &&
         ((ushort)prev_link == 0)) {
        if (prev_link._2_2_ == 0) {
          iVar3 = ngram_tg_score(_ascale_local,bprob_1,prev_link._4_4_,_w2_is_fil,&w2_wid);
          fVar5 = (float)(iVar3 >> 10) * (float)search._4_4_ + (float)iStack_7c;
        }
        else {
          iVar3 = ngram_bg_score(_ascale_local,bprob_1,prev_link._4_4_,&w2_wid);
          fVar5 = (float)(iVar3 >> 10) * (float)search._4_4_ + (float)iStack_7c;
        }
        iStack_7c = (int)fVar5;
      }
      if (*(int *)((long)(lmath->t).table + 0x1c) < iStack_7c) {
        *(int *)((long)(lmath->t).table + 0x1c) = iStack_7c;
        *(ps_latlink_t **)((long)(lmath->t).table + 0x10) = bestend;
      }
    }
    bestend = ps_lattice_traverse_next((ps_lattice_t *)lmset_local,(ps_latnode_t *)0x0);
  } while( true );
}

Assistant:

ps_latlink_t *
ps_lattice_bestpath(ps_lattice_t *dag, ngram_model_t *lmset,
                    float32 lwf, float32 ascale)
{
    ps_search_t *search;
    ps_latnode_t *node;
    ps_latlink_t *link;
    ps_latlink_t *bestend;
    latlink_list_t *x;
    logmath_t *lmath;
    int32 bestescr;

    search = dag->search;
    lmath = dag->lmath;

    /* Initialize path scores for all links exiting dag->start, and
     * set all other scores to the minimum.  Also initialize alphas to
     * log-zero. */
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next) {
            x->link->path_scr = MAX_NEG_INT32;
            x->link->alpha = logmath_get_zero(lmath);
        }
    }
    for (x = dag->start->exits; x; x = x->next) {
        int32 n_used;
        int16 to_is_fil;

        to_is_fil = dict_filler_word(ps_search_dict(search), x->link->to->basewid) && x->link->to != dag->end;

        /* Best path points to dag->start, obviously. */
        x->link->path_scr = x->link->ascr;
        if (lmset && !to_is_fil)
            x->link->path_scr += (ngram_bg_score(lmset, x->link->to->basewid,
                                ps_search_start_wid(search), &n_used) >> SENSCR_SHIFT) * lwf;
        x->link->best_prev = NULL;
        /* No predecessors for start links. */
        x->link->alpha = 0;
    }

    /* Traverse the edges in the graph, updating path scores. */
    for (link = ps_lattice_traverse_edges(dag, NULL, NULL);
         link; link = ps_lattice_traverse_next(dag, NULL)) {
        int32 bprob, n_used;
        int32 w3_wid, w2_wid;
        int16 w3_is_fil, w2_is_fil;
        ps_latlink_t *prev_link;

        /* Sanity check, we should not be traversing edges that
         * weren't previously updated, otherwise nasty overflows will result. */
        assert(link->path_scr != MAX_NEG_INT32);

        /* Find word predecessor if from-word is filler */
        w3_wid = link->from->basewid;
        w2_wid = link->to->basewid;
        w3_is_fil = dict_filler_word(ps_search_dict(search), link->from->basewid) && link->from != dag->start;
        w2_is_fil = dict_filler_word(ps_search_dict(search), w2_wid) && link->to != dag->end;
        prev_link = link;

        if (w3_is_fil) {
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Calculate common bigram probability for all alphas. */
        if (lmset && !w3_is_fil && !w2_is_fil)
            bprob = ngram_ng_prob(lmset, w2_wid, &w3_wid, 1, &n_used);
        else
            bprob = 0;
        /* Add in this link's acoustic score, which was a constant
           factor in previous computations (if any). */
        link->alpha += (link->ascr << SENSCR_SHIFT) * ascale;

        if (w2_is_fil) {
            w2_is_fil = w3_is_fil;
            w3_is_fil = TRUE;
            w2_wid = w3_wid;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                w3_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), w3_wid) || prev_link->from == dag->start) {
                    w3_is_fil = FALSE;
                    break;
                }
            }
        }

        /* Update scores for all paths exiting link->to. */
        for (x = link->to->exits; x; x = x->next) {
            int32 score;
            int32 w1_wid;
            int16 w1_is_fil;

            w1_wid = x->link->to->basewid;
            w1_is_fil = dict_filler_word(ps_search_dict(search), w1_wid) && x->link->to != dag->end;

            /* Update alpha with sum of previous alphas. */
            x->link->alpha = logmath_add(lmath, x->link->alpha, link->alpha + bprob);

            /* Update link score with maximum link score. */
            score = link->path_scr + x->link->ascr;
            /* Calculate language score for bestpath if possible */
            if (lmset && !w1_is_fil && !w2_is_fil) {
                if (w3_is_fil)
                    /* partial context available */
                    score += (ngram_bg_score(lmset, w1_wid, w2_wid, &n_used) >> SENSCR_SHIFT) * lwf;
                else
                    /* full context available */
                    score += (ngram_tg_score(lmset, w1_wid, w2_wid, w3_wid, &n_used) >> SENSCR_SHIFT) * lwf;
            }

            if (score BETTER_THAN x->link->path_scr) {
                x->link->path_scr = score;
                x->link->best_prev = link;
            }
        }
    }

    /* Find best link entering final node, and calculate normalizer
     * for posterior probabilities. */
    bestend = NULL;
    bestescr = MAX_NEG_INT32;

    /* Normalizer is the alpha for the imaginary link exiting the
       final node. */
    dag->norm = logmath_get_zero(lmath);
    for (x = dag->end->entries; x; x = x->next) {
        int32 bprob, n_used;
        int32 from_wid;
        int16 from_is_fil;

        from_wid = x->link->from->basewid;
        from_is_fil = dict_filler_word(ps_search_dict(search), from_wid) && x->link->from != dag->start;
        if (from_is_fil) {
            ps_latlink_t *prev_link = x->link;
            while (prev_link->best_prev != NULL) {
                prev_link = prev_link->best_prev;
                from_wid = prev_link->from->basewid;
                if (!dict_filler_word(ps_search_dict(search), from_wid) || prev_link->from == dag->start) {
                    from_is_fil = FALSE;
                    break;
                }
            }
        }

        if (lmset && !from_is_fil)
            bprob = ngram_ng_prob(lmset,
                                  x->link->to->basewid,
                                  &from_wid, 1, &n_used);
        else
            bprob = 0;
        dag->norm = logmath_add(lmath, dag->norm, x->link->alpha + bprob);
        if (x->link->path_scr BETTER_THAN bestescr) {
            bestescr = x->link->path_scr;
            bestend = x->link;
        }
    }
    /* FIXME: floating point... */
    /* FIXME: possible under/overflow!!! */
    dag->norm += (int32)(dag->final_node_ascr << SENSCR_SHIFT) * ascale;

    E_INFO("Bestpath score: %d\n", bestescr);
    E_INFO("Normalizer P(O) = alpha(%s:%d:%d) = %d\n",
           dict_wordstr(dag->search->dict, dag->end->wid),
           dag->end->sf, dag->end->lef,
           dag->norm);
    return bestend;
}